

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  uint8_t uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  bool bVar7;
  Command *pCVar8;
  uint32_t uVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  ulong uVar18;
  uint8_t *puVar19;
  long lVar20;
  byte bVar21;
  int *piVar22;
  BrotliEncoderDictionary *pBVar23;
  uint8_t *local_b50;
  uint8_t *local_b40;
  uint8_t *local_b30;
  uint8_t *local_b28;
  uint8_t *local_b18;
  uint8_t *local_b00;
  uint8_t *local_af0;
  ulong local_ae8;
  ulong local_ae0;
  uint8_t *local_ad0;
  uint8_t *local_ac8;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_a58;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t max_backward_limit;
  HasherHandle hasher_local;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_8f8;
  uint32_t delta;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist_2;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_7e2;
  uint32_t nbits_2;
  ushort local_7ba;
  int offset_3;
  uint16_t bits64;
  ushort local_792;
  size_t score_4;
  size_t len_4;
  size_t backward_2;
  uint *puStack_750;
  int i_2;
  uint32_t *bucket_1;
  size_t score_3;
  size_t len_3;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  int compare_char_1;
  uint32_t key_2;
  size_t cur_ix_masked_1;
  size_t best_len_in_1;
  H4 *self_2;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_670;
  size_t local_660;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_630;
  size_t local_620;
  int item_matches_1;
  size_t item_1;
  HasherCommon *self_3;
  size_t i_3;
  size_t key_3;
  uint32_t h_1;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_3;
  size_t matchlen_1;
  size_t offset_1;
  size_t dist_1;
  size_t len_5;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_490;
  size_t local_480;
  size_t score_1;
  size_t len_1;
  size_t backward;
  uint *puStack_418;
  int i;
  uint32_t *bucket;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  int compare_char;
  uint32_t key;
  size_t cur_ix_masked;
  size_t best_len_in;
  H4 *self;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_338;
  size_t local_328;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_2f8;
  size_t local_2e8;
  int item_matches;
  size_t item;
  HasherCommon *self_1;
  size_t i_1;
  size_t key_1;
  uint32_t h;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_1;
  size_t matchlen;
  size_t offset;
  size_t dist;
  size_t len_2;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_158;
  size_t local_148;
  uint8_t *local_100;
  size_t i_4;
  uint32_t off;
  uint32_t key_4;
  uint32_t off_2;
  uint32_t key_6;
  uint32_t off_1;
  uint32_t key_5;
  
  pCVar8 = commands;
  puVar11 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  pos_end = *last_insert_len;
  puVar12 = (uint8_t *)(position + num_bytes);
  local_ac8 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_ac8 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar10 = 0x200;
  if (params->quality < 9) {
    iVar10 = 0x40;
  }
  lVar13 = (long)iVar10;
  gap = position + lVar13;
  puVar19 = (uint8_t *)position;
LAB_00106ae0:
  do {
    ringbuffer_local = puVar19;
    if (puVar12 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar12 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar8 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar12 - (long)ringbuffer_local;
    local_ad0 = puVar11;
    if (ringbuffer_local < puVar11) {
      local_ad0 = ringbuffer_local;
    }
    sr.score = 0;
    sr.len = 0;
    pBVar23 = &params->dictionary;
    puVar19 = (uint8_t *)(params->dist).max_distance;
    cached_backward = 0;
    uVar14 = (ulong)ringbuffer_local & ringbuffer_mask;
    uVar9 = HashBytesH4(ringbuffer + uVar14);
    uVar1 = ringbuffer[uVar14];
    best_len = 0x7e4;
    sr.score._0_4_ = 0;
    if ((ringbuffer_local + -(long)*dist_cache < ringbuffer_local) &&
       (uVar15 = ringbuffer_mask & 0xffffffff & (ulong)(ringbuffer_local + -(long)*dist_cache),
       uVar1 == ringbuffer[uVar15])) {
      local_2f8 = (ulong *)(ringbuffer + uVar14);
      limit2 = 0;
      x = (max_distance >> 3) + 1;
LAB_00106dbd:
      x = x - 1;
      if (x != 0) {
        if (*local_2f8 == *(ulong *)(ringbuffer + limit2 + uVar15)) break;
        iVar10 = 0;
        for (uVar15 = *local_2f8 ^ *(ulong *)(ringbuffer + limit2 + uVar15); (uVar15 & 1) == 0;
            uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          iVar10 = iVar10 + 1;
        }
        local_2e8 = ((ulong)(long)iVar10 >> 3) + limit2;
        goto LAB_00106f60;
      }
      matched = (max_distance & 7) + 1;
      while (matched = matched - 1, matched != 0) {
        if (ringbuffer[limit2 + uVar15] != (uint8_t)*local_2f8) {
          local_2e8 = limit2;
          goto LAB_00106f60;
        }
        local_2f8 = (ulong *)((long)local_2f8 + 1);
        limit2 = limit2 + 1;
      }
      local_2e8 = limit2;
LAB_00106f60:
      if ((3 < local_2e8) && (uVar15 = local_2e8 * 0x87 + 0x78f, 0x7e4 < uVar15)) {
        cached_backward = local_2e8;
        uVar1 = ringbuffer[uVar14 + local_2e8];
        sr.len = (long)*dist_cache;
        best_len = uVar15;
      }
    }
    puStack_418 = (uint *)(hasher + (ulong)uVar9 * 4 + 0x28);
    uVar3 = *puStack_418;
    backward._4_4_ = 0;
    sStack_a58 = cached_backward;
    sr.distance = best_len;
    while( true ) {
      len = (size_t)uVar3;
      puStack_418 = puStack_418 + 1;
      if (3 < backward._4_4_) break;
      puVar16 = ringbuffer_local + -len;
      uVar15 = ringbuffer_mask & 0xffffffff & len;
      if ((uVar1 == ringbuffer[uVar15 + cached_backward]) &&
         (puVar16 != (uint8_t *)0x0 && puVar16 <= local_ad0)) {
        local_338 = (ulong *)(ringbuffer + uVar14);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_00107163:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_338 == *(ulong *)(ringbuffer + limit2_1 + uVar15)) goto LAB_001071c5;
          iVar10 = 0;
          for (uVar15 = *local_338 ^ *(ulong *)(ringbuffer + limit2_1 + uVar15); (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          local_328 = ((ulong)(long)iVar10 >> 3) + limit2_1;
          goto LAB_00107306;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar15] != (uint8_t)*local_338) {
            local_328 = limit2_1;
            goto LAB_00107306;
          }
          local_338 = (ulong *)((long)local_338 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_328 = limit2_1;
LAB_00107306:
        if (3 < local_328) {
          iVar10 = 0x1f;
          if ((uint)puVar16 != 0) {
            for (; (uint)puVar16 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          uVar15 = (local_328 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
          if (best_len < uVar15) {
            cached_backward = local_328;
            sStack_a58 = local_328;
            uVar1 = ringbuffer[uVar14 + local_328];
            sr.len = (size_t)puVar16;
            sr.distance = uVar15;
            best_len = uVar15;
          }
        }
      }
      backward._4_4_ = backward._4_4_ + 1;
      uVar3 = *puStack_418;
    }
    if ((sr.distance == 0x7e4) &&
       (piVar22 = (int *)(ringbuffer + uVar14),
       *(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
      i_1 = (size_t)(((uint)(*piVar22 * 0x1e35a7bd) >> 0x12) << 1);
      bVar7 = false;
      while (!bVar7) {
        uVar2 = (params->dictionary).hash_table[i_1];
        uVar14 = (ulong)uVar2;
        *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
        if (uVar14 != 0) {
          uVar15 = uVar14 & 0x1f;
          uVar18 = (ulong)(uVar2 >> 5);
          if (max_distance < uVar15) {
            bVar7 = false;
          }
          else {
            local_158 = (ulong *)(pBVar23->words->data +
                                 (ulong)pBVar23->words->offsets_by_length[uVar15] + uVar15 * uVar18)
            ;
            limit2_2 = 0;
            x_2 = (uVar15 >> 3) + 1;
LAB_001076e7:
            x_2 = x_2 - 1;
            if (x_2 != 0) {
              if (*local_158 == *(ulong *)((long)piVar22 + limit2_2)) goto LAB_00107749;
              iVar10 = 0;
              for (uVar14 = *local_158 ^ *(ulong *)((long)piVar22 + limit2_2); (uVar14 & 1) == 0;
                  uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                iVar10 = iVar10 + 1;
              }
              local_148 = ((ulong)(long)iVar10 >> 3) + limit2_2;
              goto LAB_0010788a;
            }
            matched_2 = (uVar14 & 7) + 1;
            while (matched_2 = matched_2 - 1, matched_2 != 0) {
              if (*(char *)((long)piVar22 + limit2_2) != (char)*local_158) {
                local_148 = limit2_2;
                goto LAB_0010788a;
              }
              local_158 = (ulong *)((long)local_158 + 1);
              limit2_2 = limit2_2 + 1;
            }
            local_148 = limit2_2;
LAB_0010788a:
            if ((uVar15 < local_148 + (params->dictionary).cutoffTransformsCount) &&
               (local_148 != 0)) {
              puVar16 = local_ad0 +
                        ((uVar15 - local_148) * 4 +
                         ((params->dictionary).cutoffTransforms >>
                          ((char)(uVar15 - local_148) * '\x06' & 0x3fU) & 0x3f) <<
                        (pBVar23->words->size_bits_by_length[uVar15] & 0x3f)) + uVar18 + 1;
              if (puVar19 < puVar16) {
                bVar7 = false;
              }
              else {
                iVar10 = 0x1f;
                if ((uint)puVar16 != 0) {
                  for (; (uint)puVar16 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                  }
                }
                uVar14 = (local_148 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                if (uVar14 < sr.distance) {
                  bVar7 = false;
                }
                else {
                  sStack_a58 = local_148;
                  sr.score._0_4_ = (int)uVar15 - (int)local_148;
                  bVar7 = true;
                  sr.len = (size_t)puVar16;
                  sr.distance = uVar14;
                }
              }
            }
            else {
              bVar7 = false;
            }
          }
          if (bVar7) {
            *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
          }
        }
        i_1 = i_1 + 1;
        bVar7 = true;
      }
    }
    *(int *)(hasher + ((ulong)uVar9 + ((ulong)ringbuffer_local >> 3 & 3)) * 4 + 0x28) =
         (int)ringbuffer_local;
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      do {
        max_distance = max_distance - 1;
        if (params->quality < 5) {
          local_ae0 = sStack_a58 - 1;
          if (max_distance <= local_ae0) {
            local_ae0 = max_distance;
          }
          local_ae8 = local_ae0;
        }
        else {
          local_ae8 = 0;
        }
        sr2.len = 0;
        local_af0 = puVar11;
        if (ringbuffer_local + 1 < puVar11) {
          local_af0 = ringbuffer_local + 1;
        }
        pBVar23 = &params->dictionary;
        puVar16 = ringbuffer_local + 1;
        puVar19 = (uint8_t *)(params->dist).max_distance;
        cached_backward_1 = local_ae8;
        uVar14 = (ulong)puVar16 & ringbuffer_mask;
        uVar9 = HashBytesH4(ringbuffer + uVar14);
        uVar1 = ringbuffer[uVar14 + local_ae8];
        best_len_1 = 0x7e4;
        sr2.score._0_4_ = 0;
        if ((puVar16 + -(long)*dist_cache < puVar16) &&
           (uVar15 = ringbuffer_mask & 0xffffffff & (ulong)(puVar16 + -(long)*dist_cache),
           uVar1 == ringbuffer[uVar15 + local_ae8])) {
          local_630 = (ulong *)(ringbuffer + uVar14);
          limit2_3 = 0;
          x_3 = (max_distance >> 3) + 1;
LAB_00107e32:
          x_3 = x_3 - 1;
          if (x_3 != 0) {
            if (*local_630 == *(ulong *)(ringbuffer + limit2_3 + uVar15)) goto LAB_00107e94;
            iVar10 = 0;
            for (uVar15 = *local_630 ^ *(ulong *)(ringbuffer + limit2_3 + uVar15); (uVar15 & 1) == 0
                ; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              iVar10 = iVar10 + 1;
            }
            local_620 = ((ulong)(long)iVar10 >> 3) + limit2_3;
            goto LAB_00107fd5;
          }
          matched_3 = (max_distance & 7) + 1;
          while (matched_3 = matched_3 - 1, matched_3 != 0) {
            if (ringbuffer[limit2_3 + uVar15] != (uint8_t)*local_630) {
              local_620 = limit2_3;
              goto LAB_00107fd5;
            }
            local_630 = (ulong *)((long)local_630 + 1);
            limit2_3 = limit2_3 + 1;
          }
          local_620 = limit2_3;
LAB_00107fd5:
          if ((3 < local_620) && (uVar15 = local_620 * 0x87 + 0x78f, 0x7e4 < uVar15)) {
            cached_backward_1 = local_620;
            uVar1 = ringbuffer[uVar14 + local_620];
            sr2.len = (long)*dist_cache;
            best_len_1 = uVar15;
          }
        }
        puStack_750 = (uint *)(hasher + (ulong)uVar9 * 4 + 0x28);
        uVar3 = *puStack_750;
        backward_2._4_4_ = 0;
        distance_code = cached_backward_1;
        sr2.distance = best_len_1;
        while( true ) {
          len_3 = (size_t)uVar3;
          puStack_750 = puStack_750 + 1;
          if (3 < backward_2._4_4_) break;
          puVar17 = puVar16 + -len_3;
          uVar15 = ringbuffer_mask & 0xffffffff & len_3;
          if ((uVar1 == ringbuffer[uVar15 + cached_backward_1]) &&
             (puVar17 != (uint8_t *)0x0 && puVar17 <= local_af0)) {
            local_670 = (ulong *)(ringbuffer + uVar14);
            limit2_4 = 0;
            x_4 = (max_distance >> 3) + 1;
LAB_001081d8:
            x_4 = x_4 - 1;
            if (x_4 != 0) {
              if (*local_670 == *(ulong *)(ringbuffer + limit2_4 + uVar15)) goto LAB_0010823a;
              iVar10 = 0;
              for (uVar15 = *local_670 ^ *(ulong *)(ringbuffer + limit2_4 + uVar15);
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                iVar10 = iVar10 + 1;
              }
              local_660 = ((ulong)(long)iVar10 >> 3) + limit2_4;
              goto LAB_0010837b;
            }
            matched_4 = (max_distance & 7) + 1;
            while (matched_4 = matched_4 - 1, matched_4 != 0) {
              if (ringbuffer[limit2_4 + uVar15] != (uint8_t)*local_670) {
                local_660 = limit2_4;
                goto LAB_0010837b;
              }
              local_670 = (ulong *)((long)local_670 + 1);
              limit2_4 = limit2_4 + 1;
            }
            local_660 = limit2_4;
LAB_0010837b:
            if (3 < local_660) {
              iVar10 = 0x1f;
              if ((uint)puVar17 != 0) {
                for (; (uint)puVar17 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                }
              }
              uVar15 = (local_660 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
              if (best_len_1 < uVar15) {
                cached_backward_1 = local_660;
                distance_code = local_660;
                uVar1 = ringbuffer[uVar14 + local_660];
                sr2.len = (size_t)puVar17;
                sr2.distance = uVar15;
                best_len_1 = uVar15;
              }
            }
          }
          backward_2._4_4_ = backward_2._4_4_ + 1;
          uVar3 = *puStack_750;
        }
        if ((sr2.distance == 0x7e4) &&
           (piVar22 = (int *)(ringbuffer + uVar14),
           *(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
          i_3 = (size_t)(((uint)(*piVar22 * 0x1e35a7bd) >> 0x12) << 1);
          bVar7 = false;
          while (!bVar7) {
            uVar2 = (params->dictionary).hash_table[i_3];
            uVar14 = (ulong)uVar2;
            *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
            if (uVar14 != 0) {
              uVar15 = uVar14 & 0x1f;
              uVar18 = (ulong)(uVar2 >> 5);
              if (max_distance < uVar15) {
                bVar7 = false;
              }
              else {
                local_490 = (ulong *)(pBVar23->words->data +
                                     (ulong)pBVar23->words->offsets_by_length[uVar15] +
                                     uVar15 * uVar18);
                limit2_5 = 0;
                x_5 = (uVar15 >> 3) + 1;
LAB_0010875c:
                x_5 = x_5 - 1;
                if (x_5 != 0) {
                  if (*local_490 == *(ulong *)((long)piVar22 + limit2_5)) goto LAB_001087be;
                  iVar10 = 0;
                  for (uVar14 = *local_490 ^ *(ulong *)((long)piVar22 + limit2_5); (uVar14 & 1) == 0
                      ; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                    iVar10 = iVar10 + 1;
                  }
                  local_480 = ((ulong)(long)iVar10 >> 3) + limit2_5;
                  goto LAB_001088ff;
                }
                matched_5 = (uVar14 & 7) + 1;
                while (matched_5 = matched_5 - 1, matched_5 != 0) {
                  if (*(char *)((long)piVar22 + limit2_5) != (char)*local_490) {
                    local_480 = limit2_5;
                    goto LAB_001088ff;
                  }
                  local_490 = (ulong *)((long)local_490 + 1);
                  limit2_5 = limit2_5 + 1;
                }
                local_480 = limit2_5;
LAB_001088ff:
                if ((uVar15 < local_480 + (params->dictionary).cutoffTransformsCount) &&
                   (local_480 != 0)) {
                  puVar17 = local_af0 +
                            ((uVar15 - local_480) * 4 +
                             ((params->dictionary).cutoffTransforms >>
                              ((char)(uVar15 - local_480) * '\x06' & 0x3fU) & 0x3f) <<
                            (pBVar23->words->size_bits_by_length[uVar15] & 0x3f)) + uVar18 + 1;
                  if (puVar19 < puVar17) {
                    bVar7 = false;
                  }
                  else {
                    iVar10 = 0x1f;
                    if ((uint)puVar17 != 0) {
                      for (; (uint)puVar17 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                      }
                    }
                    uVar14 = (local_480 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                    if (uVar14 < sr2.distance) {
                      bVar7 = false;
                    }
                    else {
                      distance_code = local_480;
                      sr2.score._0_4_ = (int)uVar15 - (int)local_480;
                      bVar7 = true;
                      sr2.len = (size_t)puVar17;
                      sr2.distance = uVar14;
                    }
                  }
                }
                else {
                  bVar7 = false;
                }
              }
              if (bVar7) {
                *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
              }
            }
            i_3 = i_3 + 1;
            bVar7 = true;
          }
        }
        *(int *)(hasher + ((ulong)uVar9 + ((ulong)puVar16 >> 3 & 3)) * 4 + 0x28) = (int)puVar16;
        puVar19 = ringbuffer_local;
        uVar3 = (uint)sr.score;
        if (sr2.distance < sr.distance + 0xaf) goto LAB_00108be4;
        puVar19 = ringbuffer_local + 1;
        pos_end = pos_end + 1;
        sStack_a58 = distance_code;
        sr.len = sr2.len;
        sr.distance = sr2.distance;
        sr.score = (size_t)(uint)sr2.score;
        cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
        uVar3 = (uint)sr2.score;
        if ((3 < cost_diff_lazy._4_4_) ||
           (puVar16 = ringbuffer_local + 9, ringbuffer_local = puVar19, puVar12 <= puVar16))
        goto LAB_00108be4;
      } while( true );
    }
    pos_end = pos_end + 1;
    puVar19 = ringbuffer_local + 1;
    if (gap < puVar19) {
      if ((uint8_t *)(gap + lVar13 * 4) < puVar19) {
        puVar16 = ringbuffer_local + 0x11;
        local_b40 = puVar12 + -7;
        ringbuffer_local = puVar19;
        if (puVar16 < local_b40) {
          local_b40 = puVar16;
        }
        for (; puVar19 = ringbuffer_local, ringbuffer_local < local_b40;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar9 = HashBytesH4(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          *(int *)(hasher + (ulong)(uVar9 + ((uint)((ulong)ringbuffer_local >> 3) & 3)) * 4 + 0x28)
               = (int)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar16 = ringbuffer_local + 9;
        local_b50 = puVar12 + -7;
        ringbuffer_local = puVar19;
        if (puVar16 < local_b50) {
          local_b50 = puVar16;
        }
        for (; puVar19 = ringbuffer_local, ringbuffer_local < local_b50;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar9 = HashBytesH4(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          *(int *)(hasher + (ulong)(uVar9 + ((uint)((ulong)ringbuffer_local >> 3) & 3)) * 4 + 0x28)
               = (int)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
  local_2f8 = local_2f8 + 1;
  limit2 = limit2 + 8;
  goto LAB_00106dbd;
LAB_00107749:
  local_158 = local_158 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_001076e7;
LAB_00107e94:
  local_630 = local_630 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00107e32;
LAB_001087be:
  local_490 = local_490 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_0010875c;
LAB_00108be4:
  sr.score._0_4_ = uVar3;
  ringbuffer_local = puVar19;
  gap = (size_t)(ringbuffer_local + lVar13 + sStack_a58 * 2);
  local_b00 = puVar11;
  if (ringbuffer_local < puVar11) {
    local_b00 = ringbuffer_local;
  }
  if (sr.len <= local_b00) {
    uVar14 = (sr.len + 3) - (long)*dist_cache;
    uVar15 = (sr.len + 3) - (long)dist_cache[1];
    if (sr.len == (long)*dist_cache) {
      local_8f8 = 0;
      goto LAB_00108e07;
    }
    if (sr.len == (long)dist_cache[1]) {
      local_8f8 = 1;
      goto LAB_00108e07;
    }
    if (uVar14 < 7) {
      local_8f8 = (ulong)(int)(0x9750468 >> ((byte)((uVar14 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_00108e07;
    }
    if (uVar15 < 7) {
      local_8f8 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar15 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_00108e07;
    }
    if (sr.len == (long)dist_cache[2]) {
      local_8f8 = 2;
      goto LAB_00108e07;
    }
    if (sr.len == (long)dist_cache[3]) {
      local_8f8 = 3;
      goto LAB_00108e07;
    }
  }
  local_8f8 = sr.len + 0xf;
LAB_00108e07:
  if ((sr.len <= local_b00) && (local_8f8 != 0)) {
    dist_cache[3] = dist_cache[2];
    dist_cache[2] = dist_cache[1];
    dist_cache[1] = *dist_cache;
    *dist_cache = (int)sr.len;
  }
  uVar9 = (uint32_t)pos_end;
  commands->insert_len_ = uVar9;
  commands->copy_len_ = (uint)sStack_a58 | (uint)sr.score << 0x19;
  uVar3 = (params->dist).num_direct_distance_codes;
  uVar4 = (params->dist).distance_postfix_bits;
  if (local_8f8 < (ulong)uVar3 + 0x10) {
    commands->dist_prefix_ = (uint16_t)local_8f8;
    commands->dist_extra_ = 0;
  }
  else {
    bVar6 = (byte)uVar4;
    uVar14 = (1L << (bVar6 + 2 & 0x3f)) + ((local_8f8 - 0x10) - (ulong)uVar3);
    iVar10 = 0x1f;
    if ((uint)uVar14 != 0) {
      for (; (uint)uVar14 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    bVar21 = (byte)(iVar10 - 1U);
    uVar15 = uVar14 >> (bVar21 & 0x3f) & 1;
    lVar20 = (ulong)(iVar10 - 1U) - (ulong)uVar4;
    commands->dist_prefix_ =
         (short)lVar20 * 0x400 |
         (short)uVar3 + 0x10 + (short)((lVar20 + -1) * 2 + uVar15 << (bVar6 & 0x3f)) +
         ((ushort)uVar14 & (short)(1 << (bVar6 & 0x1f)) - 1U);
    commands->dist_extra_ = (uint32_t)(uVar14 - (uVar15 + 2 << (bVar21 & 0x3f)) >> (bVar6 & 0x3f));
  }
  iVar10 = (uint)sStack_a58 + (uint)sr.score;
  uVar14 = (ulong)iVar10;
  if (pos_end < 6) {
    local_7e2 = (ushort)pos_end;
  }
  else if (pos_end < 0x82) {
    iVar5 = 0x1f;
    if (uVar9 - 2 != 0) {
      for (; uVar9 - 2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_7e2 = (short)(iVar5 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar5 + -1) & 0x3f)) + 2;
  }
  else if (pos_end < 0x842) {
    iVar5 = 0x1f;
    if (uVar9 - 0x42 != 0) {
      for (; uVar9 - 0x42 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_7e2 = (short)iVar5 + 10;
  }
  else if (pos_end < 0x1842) {
    local_7e2 = 0x15;
  }
  else if (pos_end < 0x5842) {
    local_7e2 = 0x16;
  }
  else {
    local_7e2 = 0x17;
  }
  if (uVar14 < 10) {
    local_7ba = (short)iVar10 - 2;
  }
  else if (uVar14 < 0x86) {
    iVar5 = 0x1f;
    if (iVar10 - 6U != 0) {
      for (; iVar10 - 6U >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_7ba = (short)(iVar5 + -1) * 2 + (short)(uVar14 - 6 >> ((byte)(iVar5 + -1) & 0x3f)) + 4;
  }
  else if (uVar14 < 0x846) {
    iVar5 = 0x1f;
    if (iVar10 - 0x46U != 0) {
      for (; iVar10 - 0x46U >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    local_7ba = (short)iVar5 + 0xc;
  }
  else {
    local_7ba = 0x17;
  }
  local_792 = local_7ba & 7 | (local_7e2 & 7) << 3;
  if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_7e2 < 8)) && (local_7ba < 0x10)) {
    if (7 < local_7ba) {
      local_792 = local_792 | 0x40;
    }
  }
  else {
    iVar10 = ((int)(uint)local_7ba >> 3) + ((int)(uint)local_7e2 >> 3) * 3;
    local_792 = (short)iVar10 * 0x40 + 0x40 +
                ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) | local_792;
  }
  commands->cmd_prefix_ = local_792;
  *num_literals = pos_end + *num_literals;
  pos_end = 0;
  range_end = (size_t)(ringbuffer_local + 2);
  local_b18 = ringbuffer_local + sStack_a58;
  if (local_ac8 <= local_b18) {
    local_b18 = local_ac8;
  }
  if (sr.len < sStack_a58 >> 2) {
    local_b28 = ringbuffer_local + sr.len * -4 + sStack_a58;
    if (local_b28 < range_end) {
      local_b28 = (uint8_t *)range_end;
    }
    if (local_b18 < local_b28) {
      local_b30 = local_b18;
    }
    else {
      local_b30 = local_b28;
    }
    range_end = (size_t)local_b30;
  }
  for (local_100 = (uint8_t *)range_end; local_100 < local_b18; local_100 = local_100 + 1) {
    uVar9 = HashBytesH4(ringbuffer + ((ulong)local_100 & ringbuffer_mask));
    *(int *)(hasher + (ulong)(uVar9 + ((uint)((ulong)local_100 >> 3) & 3)) * 4 + 0x28) =
         (int)local_100;
  }
  commands = commands + 1;
  puVar19 = ringbuffer_local + sStack_a58;
  goto LAB_00106ae0;
LAB_0010823a:
  local_670 = local_670 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_001081d8;
LAB_001071c5:
  local_338 = local_338 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00107163;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}